

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_adaptor_verify
              (secp256k1_context *ctx,uchar *adaptor_sig162,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *enckey)

{
  int iVar1;
  secp256k1_scalar *rzr;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge pubkey_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar e_neg;
  secp256k1_ge rp;
  secp256k1_scalar msg;
  secp256k1_scalar e_expected;
  secp256k1_gej derived_rp;
  secp256k1_scalar u1;
  secp256k1_ge enckey_ge;
  secp256k1_ge r;
  secp256k1_scalar u2;
  secp256k1_gej pubkeyj;
  secp256k1_scalar sn;
  secp256k1_ge r2;
  secp256k1_scalar local_5b8;
  secp256k1_gej local_598;
  secp256k1_scalar local_510;
  secp256k1_scalar local_4f0;
  secp256k1_scalar local_4d0;
  secp256k1_scalar local_4b0;
  secp256k1_ge local_490;
  secp256k1_gej local_438;
  secp256k1_scalar local_3b8;
  secp256k1_gej local_398;
  secp256k1_gej local_310;
  secp256k1_ge local_290;
  secp256k1_ge local_238;
  secp256k1_ge local_1e0;
  secp256k1_gej local_188;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  if (adaptor_sig162 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_verify_cold_4();
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ecdsa_adaptor_verify_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_ecdsa_adaptor_verify_cold_2();
  }
  else {
    if (enckey != (secp256k1_pubkey *)0x0) {
      iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        (&local_238,&local_510,&local_490,&local_4f0,&local_4d0,&local_5b8,
                         adaptor_sig162);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&local_290,enckey);
      if (iVar1 == 0) {
        return 0;
      }
      local_188.infinity = local_490.infinity;
      local_188.x.n[0] = local_490.x.n[0];
      local_188.x.n[1] = local_490.x.n[1];
      local_188.x.n[2] = local_490.x.n[2];
      local_188.x.n[3] = local_490.x.n[3];
      local_188.x.n[4] = local_490.x.n[4];
      local_188.y.n[0] = local_490.y.n[0];
      local_188.y.n[1] = local_490.y.n[1];
      local_188.y.n[2] = local_490.y.n[2];
      local_188.y.n[3] = local_490.y.n[3];
      local_188.y.n[4] = local_490.y.n[4];
      local_188.z.n[0] = 1;
      local_188.z.n[3] = 0;
      local_188.z.n[4] = 0;
      local_188.z.n[1] = 0;
      local_188.z.n[2] = 0;
      local_598.infinity = local_238.infinity;
      local_598.x.n[4] = local_238.x.n[4];
      local_598.x.n[2] = local_238.x.n[2];
      local_598.x.n[3] = local_238.x.n[3];
      local_598.x.n[0] = local_238.x.n[0];
      local_598.x.n[1] = local_238.x.n[1];
      local_598.y.n[4] = local_238.y.n[4];
      local_598.y.n[2] = local_238.y.n[2];
      local_598.y.n[3] = local_238.y.n[3];
      local_598.y.n[0] = local_238.y.n[0];
      local_598.y.n[1] = local_238.y.n[1];
      local_598.z.n[0] = 1;
      local_598.z.n[3] = 0;
      local_598.z.n[4] = 0;
      local_598.z.n[1] = 0;
      local_598.z.n[2] = 0;
      secp256k1_scalar_negate(&local_4b0,&local_4d0);
      secp256k1_ecmult(&local_438,&local_188,&local_4b0,&local_5b8);
      secp256k1_ecmult(&local_310,&local_598,&local_4b0,&secp256k1_scalar_zero);
      local_398.infinity = local_290.infinity;
      local_398.x.n[0] = local_290.x.n[0];
      local_398.x.n[1] = local_290.x.n[1];
      local_398.x.n[2] = local_290.x.n[2];
      local_398.x.n[3] = local_290.x.n[3];
      local_398.x.n[4] = local_290.x.n[4];
      local_398.y.n[0] = local_290.y.n[0];
      local_398.y.n[1] = local_290.y.n[1];
      local_398.y.n[2] = local_290.y.n[2];
      local_398.y.n[3] = local_290.y.n[3];
      local_398.y.n[4] = local_290.y.n[4];
      local_398.z.n[0] = 1;
      local_398.z.n[1] = 0;
      local_398.z.n[2] = 0;
      local_398.z.n[3] = 0;
      local_398.z.n[4] = 0;
      rzr = &secp256k1_scalar_zero;
      secp256k1_ecmult(&local_108,&local_398,&local_5b8,&secp256k1_scalar_zero);
      secp256k1_gej_add_var(&local_108,&local_108,&local_310,(secp256k1_fe *)rzr);
      secp256k1_ge_set_gej(&local_1e0,&local_438);
      secp256k1_ge_set_gej(&local_88,&local_108);
      secp256k1_dleq_challenge(&local_3b8,&local_290,&local_1e0,&local_88,&local_490,&local_238);
      secp256k1_scalar_add(&local_3b8,&local_3b8,&local_4b0);
      if (((local_3b8.d[1] != 0 || local_3b8.d[0] != 0) || local_3b8.d[2] != 0) ||
          local_3b8.d[3] != 0) {
        return 0;
      }
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_438,msg32,(int *)0x0);
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&local_598,pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_inverse_var((secp256k1_scalar *)&local_108,&local_4f0);
      secp256k1_scalar_mul
                ((secp256k1_scalar *)&local_310,(secp256k1_scalar *)&local_108,
                 (secp256k1_scalar *)&local_438);
      secp256k1_scalar_mul((secp256k1_scalar *)&local_1e0,(secp256k1_scalar *)&local_108,&local_510)
      ;
      local_188.infinity = (int)local_598.z.n[0];
      local_188.x.n[0] = local_598.x.n[0];
      local_188.x.n[1] = local_598.x.n[1];
      local_188.x.n[2] = local_598.x.n[2];
      local_188.x.n[3] = local_598.x.n[3];
      local_188.x.n[4] = local_598.x.n[4];
      local_188.y.n[0] = local_598.y.n[0];
      local_188.y.n[1] = local_598.y.n[1];
      local_188.y.n[2] = local_598.y.n[2];
      local_188.y.n[3] = local_598.y.n[3];
      local_188.y.n[4] = local_598.y.n[4];
      local_188.z.n[0] = 1;
      local_188.z.n[1] = 0;
      local_188.z.n[2] = 0;
      local_188.z.n[3] = 0;
      local_188.z.n[4] = 0;
      secp256k1_ecmult(&local_398,&local_188,(secp256k1_scalar *)&local_1e0,
                       (secp256k1_scalar *)&local_310);
      if (local_398.infinity != 0) {
        return 0;
      }
      secp256k1_gej_neg(&local_398,&local_398);
      secp256k1_gej_add_ge_var(&local_398,&local_398,&local_490,(secp256k1_fe *)0x0);
      return local_398.infinity;
    }
    secp256k1_ecdsa_adaptor_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig162, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *enckey) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge pubkey_ge;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge enckey_ge;
    secp256k1_gej derived_rp;
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &rp, &sp, &dleq_proof_e, &dleq_proof_s, adaptor_sig162)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &enckey_ge, enckey)) {
        return 0;
    }
    /* DLEQ_verify((R', Y, R), dleq_proof) */
    if(!secp256k1_dleq_verify(&dleq_proof_s, &dleq_proof_e, &rp, &enckey_ge, &r)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    /* return R' == s'⁻¹(m * G + R.x * X) */
    secp256k1_scalar_inverse_var(&sn, &sp);
    secp256k1_scalar_mul(&u1, &sn, &msg);
    secp256k1_scalar_mul(&u2, &sn, &sigr);
    secp256k1_gej_set_ge(&pubkeyj, &pubkey_ge);
    secp256k1_ecmult(&derived_rp, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&derived_rp)) {
        return 0;
    }
    secp256k1_gej_neg(&derived_rp, &derived_rp);
    secp256k1_gej_add_ge_var(&derived_rp, &derived_rp, &rp, NULL);
    return secp256k1_gej_is_infinity(&derived_rp);
}